

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::addIntToReg(CodeGen *codeGen,ExtendedRegisters destReg,int srcValue)

{
  size_t i;
  long lVar1;
  IntToBytes converter;
  ExtendedRegisters local_1f;
  uchar local_1e [2];
  int local_1c;
  
  local_1e[1] = 0x49;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1e + 1);
  local_1e[0] = 0x81;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,local_1e);
  local_1f = destReg | 0xc0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,&local_1f);
  local_1c = srcValue;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_1c + lVar1));
  }
  return;
}

Assistant:

void Amd64Backend::addIntToReg(CodeGen& codeGen, ExtendedRegisters destReg, int srcValue) {
		codeGen.push_back(0x49);
		codeGen.push_back(0x81);
		codeGen.push_back(0xc0 | (Byte)destReg);

		IntToBytes converter;
		converter.intValue = srcValue;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}